

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O2

void __thiscall
icu_63::NFSubstitution::doSubstitution
          (NFSubstitution *this,double number,UnicodeString *toInsertInto,int32_t _pos,
          int32_t recursionCount,UErrorCode *status)

{
  NFRuleSet *pNVar1;
  UBool UVar2;
  NFRule *this_00;
  int64_t number_00;
  double number_01;
  double dVar3;
  UnicodeString temp;
  UnicodeString local_70;
  
  (*(this->super_UObject)._vptr_UObject[9])();
  UVar2 = uprv_isInfinite_63(number_01);
  if (UVar2 != '\0') {
    pNVar1 = this->ruleSet;
    dVar3 = uprv_getInfinity_63();
    this_00 = NFRuleSet::findDoubleRule(pNVar1,dVar3);
    NFRule::doFormat(this_00,number_01,toInsertInto,_pos + this->pos,recursionCount,status);
    return;
  }
  dVar3 = uprv_floor_63(number_01);
  pNVar1 = this->ruleSet;
  if ((number_01 != dVar3) || (NAN(number_01) || NAN(dVar3))) {
    if (pNVar1 != (NFRuleSet *)0x0) {
      NFRuleSet::format(pNVar1,number_01,toInsertInto,_pos + this->pos,recursionCount,status);
      return;
    }
  }
  else if (pNVar1 != (NFRuleSet *)0x0) {
    number_00 = util64_fromDouble(number_01);
    NFRuleSet::format(pNVar1,number_00,toInsertInto,_pos + this->pos,recursionCount,status);
    return;
  }
  if (this->numberFormat != (DecimalFormat *)0x0) {
    local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003a7268;
    local_70.fUnion.fStackFields.fLengthAndFlags = 2;
    NumberFormat::format(&this->numberFormat->super_NumberFormat,number_01,&local_70);
    UnicodeString::insert(toInsertInto,_pos + this->pos,&local_70);
    UnicodeString::~UnicodeString(&local_70);
  }
  return;
}

Assistant:

void
NFSubstitution::doSubstitution(double number, UnicodeString& toInsertInto, int32_t _pos, int32_t recursionCount, UErrorCode& status) const {
    // perform a transformation on the number being formatted that
    // is dependent on the type of substitution this is
    double numberToFormat = transformNumber(number);

    if (uprv_isInfinite(numberToFormat)) {
        // This is probably a minus rule. Combine it with an infinite rule.
        const NFRule *infiniteRule = ruleSet->findDoubleRule(uprv_getInfinity());
        infiniteRule->doFormat(numberToFormat, toInsertInto, _pos + this->pos, recursionCount, status);
        return;
    }

    // if the result is an integer, from here on out we work in integer
    // space (saving time and memory and preserving accuracy)
    if (numberToFormat == uprv_floor(numberToFormat) && ruleSet != NULL) {
        ruleSet->format(util64_fromDouble(numberToFormat), toInsertInto, _pos + this->pos, recursionCount, status);

        // if the result isn't an integer, then call either our rule set's
        // format() method or our DecimalFormat's format() method to
        // format the result
    } else {
        if (ruleSet != NULL) {
            ruleSet->format(numberToFormat, toInsertInto, _pos + this->pos, recursionCount, status);
        } else if (numberFormat != NULL) {
            UnicodeString temp;
            numberFormat->format(numberToFormat, temp);
            toInsertInto.insert(_pos + this->pos, temp);
        }
    }
}